

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLoopTests.cpp
# Opt level: O2

void deqp::evalLoop3Iters(ShaderEvalContext *c)

{
  Vector<float,_3> local_24;
  VecAccess<float,_4,_3> local_18;
  
  local_24.m_data[0] = (c->coords).m_data[3];
  local_24.m_data._4_8_ = *(undefined8 *)(c->coords).m_data;
  local_18.m_vector = &c->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_24);
  return;
}

Assistant:

static void evalLoop3Iters(ShaderEvalContext& c)
{
	c.color.xyz() = c.coords.swizzle(3, 0, 1);
}